

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O1

void Abc_NtkDressPrintEquivs(Vec_Ptr_t *vRes)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  
  if (0 < vRes->nSize) {
    uVar3 = 0;
    do {
      pvVar2 = vRes->pArray[uVar3];
      printf("Class %5d : ",uVar3 & 0xffffffff);
      printf("Num =%5d    ",(ulong)*(uint *)((long)pvVar2 + 4));
      if (0 < *(int *)((long)pvVar2 + 4)) {
        lVar4 = 0;
        do {
          uVar1 = *(uint *)(*(long *)((long)pvVar2 + 8) + lVar4 * 4);
          printf("%5d%c%d ",(ulong)(uint)((int)uVar1 >> 2),(ulong)((uVar1 & 2) + 0x2b),
                 (ulong)(uVar1 & 1));
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)((long)pvVar2 + 4));
      }
      putchar(10);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)vRes->nSize);
  }
  return;
}

Assistant:

void Abc_NtkDressPrintEquivs( Vec_Ptr_t * vRes )
{
    Vec_Int_t * vClass;
    int i, k, Entry;
    Vec_PtrForEachEntry( Vec_Int_t *, vRes, vClass, i )
    {
        printf( "Class %5d : ", i );
        printf( "Num =%5d    ", Vec_IntSize(vClass) );
        Vec_IntForEachEntry( vClass, Entry, k )
            printf( "%5d%c%d ", 
                Abc_ObjEquivId2ObjId(Entry), 
                Abc_ObjEquivId2Polar(Entry)? '-':'+', 
                Abc_ObjEquivId2NtkId(Entry) );
        printf( "\n" );
    }
}